

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeviceContextBase.hpp
# Opt level: O0

void __thiscall
Diligent::DeviceContextBase<Diligent::EngineVkImplTraits>::FinishCommandList
          (DeviceContextBase<Diligent::EngineVkImplTraits> *this)

{
  bool bVar1;
  Char *pCVar2;
  ulong local_68;
  size_t i;
  string msg_1;
  undefined1 local_30 [8];
  string msg;
  DeviceContextBase<Diligent::EngineVkImplTraits> *this_local;
  
  msg.field_2._8_8_ = this;
  bVar1 = IsDeferred(this);
  if (!bVar1) {
    FormatString<char[59]>
              ((string *)local_30,
               (char (*) [59])"FinishCommandList() is only allowed for deferred contexts.");
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x209);
    std::__cxx11::string::~string((string *)local_30);
  }
  bVar1 = IsRecordingDeferredCommands(this);
  if (!bVar1) {
    FormatString<char[85]>
              ((string *)&i,
               (char (*) [85])
               "This context is not recording commands. Call Begin() before finishing the recording."
              );
    pCVar2 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar2,"FinishCommandList",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngine/include/DeviceContextBase.hpp"
               ,0x20a);
    std::__cxx11::string::~string((string *)&i);
  }
  IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag>::operator=
            ((IndexWrapper<unsigned_char,Diligent::_DeviceContextIndexTag> *)
             &this->m_DstImmediateContextId,&INVALID_CONTEXT_ID);
  (this->m_Desc).QueueType = COMMAND_QUEUE_TYPE_UNKNOWN;
  for (local_68 = 0; local_68 < 3; local_68 = local_68 + 1) {
    (this->m_Desc).TextureCopyGranularity[local_68] = 0;
  }
  return;
}

Assistant:

void FinishCommandList()
    {
        DEV_CHECK_ERR(IsDeferred(), "FinishCommandList() is only allowed for deferred contexts.");
        DEV_CHECK_ERR(IsRecordingDeferredCommands(), "This context is not recording commands. Call Begin() before finishing the recording.");
        m_DstImmediateContextId = INVALID_CONTEXT_ID;
        m_Desc.QueueType        = COMMAND_QUEUE_TYPE_UNKNOWN;
        for (size_t i = 0; i < _countof(m_Desc.TextureCopyGranularity); ++i)
            m_Desc.TextureCopyGranularity[i] = 0;
    }